

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

bool __thiscall deqp::gles31::SSBOLayoutCase::execute(SSBOLayoutCase *this,deUint32 program)

{
  pointer *this_00;
  int iVar1;
  GLuint index;
  GLenum GVar2;
  undefined4 extraout_var;
  void *pvVar3;
  TestError *pTVar4;
  allocator<char> local_25a;
  allocator_type local_259;
  Buffer acBuffer;
  InterfaceBlockInfo acBufferInfo;
  InterfaceVariableInfo acVarInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> emptyData;
  Functions *gl;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  index = (*gl->getProgramResourceIndex)(program,0x92e1,"ac_numPassed");
  if (index == 0xffffffff) {
    acVarInfo.name._M_dataplus._M_p = (pointer)&acVarInfo.name.field_2;
    acVarInfo.name._M_string_length = 0;
    acVarInfo.name.field_2._M_local_buf[0] = '\0';
    acVarInfo.index = 0xffffffff;
    acVarInfo.blockIndex = 0xffffffff;
    acVarInfo.atomicCounterBufferIndex = 0xffffffff;
    acVarInfo.type = 0;
    acVarInfo.arraySize = 0;
    acVarInfo.offset = 0;
    acVarInfo.arrayStride = 0;
    acVarInfo._60_5_ = 0;
    acVarInfo._65_8_ = 0;
  }
  else {
    glu::getProgramInterfaceVariableInfo(&acVarInfo,gl,program,0x92e1,index);
    if (acVarInfo.atomicCounterBufferIndex != 0xffffffff) {
      glu::getProgramInterfaceBlockInfo
                (&acBufferInfo,gl,program,0x92c0,acVarInfo.atomicCounterBufferIndex);
      goto LAB_013c8554;
    }
  }
  acBufferInfo.name._M_dataplus._M_p = (pointer)&acBufferInfo.name.field_2;
  acBufferInfo.name._M_string_length = 0;
  acBufferInfo.name.field_2._M_local_buf[0] = '\0';
  acBufferInfo.index = 0xffffffff;
  acBufferInfo.bufferBinding = 0;
  acBufferInfo.dataSize = 0;
  acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_013c8554:
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&acBuffer,this->m_renderCtx);
  if (index == 0xffffffff) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emptyData,"No location for ac_numPassed found",&local_25a);
    tcu::TestError::TestError(pTVar4,(string *)&emptyData);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (acBufferInfo.index == 0xffffffff) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emptyData,"ac_numPassed buffer index is GL_INVALID_INDEX",&local_25a);
    tcu::TestError::TestError(pTVar4,(string *)&emptyData);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((ulong)acBufferInfo.dataSize == 0) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emptyData,"ac_numPassed buffer size = 0",&local_25a);
    tcu::TestError::TestError(pTVar4,(string *)&emptyData);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_25a = (allocator<char>)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&emptyData,(ulong)acBufferInfo.dataSize,(value_type_conflict5 *)&local_25a,&local_259);
  (*gl->bindBuffer)(0x92c0,acBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x92c0,(long)emptyData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)emptyData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                    emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,0x88e5);
  (*gl->bindBufferBase)(0x92c0,acBufferInfo.index,acBuffer.super_ObjectWrapper.m_object);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Setting up buffer for ac_numPassed failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa45);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (*gl->useProgram)(program);
  (*gl->dispatchCompute)(1,1,1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glDispatchCompute() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa4a);
  pvVar3 = (*gl->mapBufferRange)(0x92c0,0,(ulong)acBufferInfo.dataSize,1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa52);
  if (pvVar3 != (void *)0x0) {
    iVar1 = *(int *)((long)pvVar3 + (ulong)acVarInfo.offset);
    (*gl->unmapBuffer)(0x92c0);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                    ,0xa58);
    if (iVar1 != 1) {
      emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      this_00 = &emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"ERROR: ac_numPassed = ");
      std::ostream::operator<<(this_00,iVar1);
      std::operator<<((ostream *)this_00,", expected ");
      std::ostream::operator<<(this_00,1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&emptyData,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"Shader execution failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                    ,0xa61);
    glu::ObjectWrapper::~ObjectWrapper(&acBuffer.super_ObjectWrapper);
    glu::InterfaceBlockInfo::~InterfaceBlockInfo(&acBufferInfo);
    std::__cxx11::string::~string((string *)&acVarInfo);
    return iVar1 == 1;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
             ,0xa53);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SSBOLayoutCase::execute (deUint32 program)
{
	const glw::Functions&				gl				= m_renderCtx.getFunctions();
	const deUint32						numPassedLoc	= gl.getProgramResourceIndex(program, GL_UNIFORM, "ac_numPassed");
	const glu::InterfaceVariableInfo	acVarInfo		= numPassedLoc != GL_INVALID_INDEX ? glu::getProgramInterfaceVariableInfo(gl, program, GL_UNIFORM, numPassedLoc)
																						   : glu::InterfaceVariableInfo();
	const glu::InterfaceBlockInfo		acBufferInfo	= acVarInfo.atomicCounterBufferIndex != GL_INVALID_INDEX ? glu::getProgramInterfaceBlockInfo(gl, program, GL_ATOMIC_COUNTER_BUFFER, acVarInfo.atomicCounterBufferIndex)
																												 : glu::InterfaceBlockInfo();
	const glu::Buffer					acBuffer		(m_renderCtx);
	bool								isOk			= true;

	if (numPassedLoc == GL_INVALID_INDEX)
		throw tcu::TestError("No location for ac_numPassed found");

	if (acBufferInfo.index == GL_INVALID_INDEX)
		throw tcu::TestError("ac_numPassed buffer index is GL_INVALID_INDEX");

	if (acBufferInfo.dataSize == 0)
		throw tcu::TestError("ac_numPassed buffer size = 0");

	// Initialize atomic counter buffer.
	{
		vector<deUint8> emptyData(acBufferInfo.dataSize, 0);

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *acBuffer);
		gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, (glw::GLsizeiptr)emptyData.size(), &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, acBufferInfo.index, *acBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setting up buffer for ac_numPassed failed");
	}

	gl.useProgram(program);
	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	// Read back ac_numPassed data.
	{
		const void*	mapPtr		= gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, acBufferInfo.dataSize, GL_MAP_READ_BIT);
		const int	refCount	= 1;
		int			resCount	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed");
		TCU_CHECK(mapPtr);

		resCount = *(const int*)((const deUint8*)mapPtr + acVarInfo.offset);

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed");

		if (refCount != resCount)
		{
			m_testCtx.getLog() << TestLog::Message << "ERROR: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
			isOk = false;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Shader execution failed");

	return isOk;
}